

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

bool __thiscall iDynTree::CubicSpline::computeCoefficients(CubicSpline *this)

{
  VectorDynSize *this_00;
  VectorDynSize *this_01;
  VectorDynSize *this_02;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  size_t sVar8;
  pointer pVVar9;
  long lVar10;
  ulong index;
  bool bVar11;
  
  bVar11 = true;
  if (this->m_areCoefficientsUpdated == false) {
    dVar1 = this->m_v0;
    this_00 = &this->m_velocities;
    bVar11 = false;
    pdVar7 = VectorDynSize::operator()(this_00,0);
    *pdVar7 = dVar1;
    dVar1 = this->m_vf;
    sVar8 = VectorDynSize::size(this_00);
    pdVar7 = VectorDynSize::operator()(this_00,sVar8 - 1);
    *pdVar7 = dVar1;
    bVar6 = computePhasesDuration(this);
    if (bVar6) {
      sVar8 = VectorDynSize::size(this_00);
      if (2 < sVar8) {
        computeIntermediateVelocities(this);
      }
      this_01 = &this->m_y;
      this_02 = &this->m_T;
      pVVar9 = (this->m_coefficients).
               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = 0;
      index = 0;
      while (index < (ulong)((long)(this->m_coefficients).
                                   super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 5))
      {
        pdVar7 = VectorDynSize::operator()(this_01,index);
        *(double *)
         ((long)((this->m_coefficients).
                 super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10) = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_00,index);
        *(double *)
         ((long)((this->m_coefficients).
                 super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 8) = *pdVar7;
        sVar8 = index + 1;
        pdVar7 = VectorDynSize::operator()(this_01,sVar8);
        dVar1 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_01,index);
        dVar2 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_02,index);
        dVar3 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_00,index);
        dVar4 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_00,sVar8);
        dVar5 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_02,index);
        *(double *)
         ((long)((this->m_coefficients).
                 super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 0x10) =
             ((((dVar1 - dVar2) * 3.0) / dVar3 - (dVar4 + dVar4)) - dVar5) / *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_01,index);
        dVar1 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_01,sVar8);
        dVar2 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_02,index);
        dVar3 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_00,index);
        dVar4 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_00,sVar8);
        dVar5 = *pdVar7;
        pdVar7 = VectorDynSize::operator()(this_02,index);
        pVVar9 = (this->m_coefficients).
                 super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)pVVar9->m_data + lVar10 + 0x18) =
             (((dVar1 - dVar2) + (dVar1 - dVar2)) / dVar3 + dVar4 + dVar5) / (*pdVar7 * *pdVar7);
        lVar10 = lVar10 + 0x20;
        index = sVar8;
      }
      this->m_areCoefficientsUpdated = true;
      bVar11 = true;
    }
  }
  return bVar11;
}

Assistant:

bool iDynTree::CubicSpline::computeCoefficients()
{
    // the coefficients are updated. No need to recompute them
    if(m_areCoefficientsUpdated){
        return true;
    }

    m_velocities(0) = m_v0;
    m_velocities(m_velocities.size() - 1) = m_vf;

    if(!this->computePhasesDuration())
        return false;

    if(m_velocities.size() > 2){
        if(!this->computeIntermediateVelocities())
            return false;
    }

    for(size_t i = 0; i < m_coefficients.size(); ++i){
        m_coefficients[i](0) = m_y(i);
        m_coefficients[i](1) = m_velocities(i);
        m_coefficients[i](2) = ( 3*(m_y(i+1) - m_y(i))/m_T(i) - 2*m_velocities(i) - m_velocities(i+1) )/m_T(i);
        m_coefficients[i](3) = ( 2*(m_y(i) - m_y(i+1))/m_T(i) + m_velocities(i) + m_velocities(i+1) )/std::pow(m_T(i), 2);
    }

    // The coefficients are now updated.
    m_areCoefficientsUpdated = true;

    return true;
}